

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int sort_5_3::merge_sort_5(int *a,int low,int high)

{
  code *pcVar1;
  int high_00;
  int m;
  int high_local;
  int low_local;
  int *a_local;
  
  if (low < high) {
    high_00 = (low + high) / 2;
    merge_sort_5(a,low,high_00);
    merge_sort_5(a,high_00 + 1,high);
    merge_5(a,low,high,high_00);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int merge_sort_5(int *a, int low, int high) {
        if (low < high) {
            int m = (low + high) / 2;
            merge_sort_5(a, low, m);
            merge_sort_5(a, m + 1, high);
            merge_5(a, low, high, m);
        }
    }